

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O2

int CVmObjString::getp_md5(vm_val_t *retval,vm_val_t *self_val,char *str,uint *argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  char hash [33];
  
  if (getp_md5(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    iVar1 = __cxa_guard_acquire(&getp_md5(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc
                               );
    if (iVar1 != 0) {
      getp_md5::desc.min_argc_ = 0;
      getp_md5::desc.opt_argc_ = 0;
      getp_md5::desc.varargs_ = 0;
      __cxa_guard_release(&getp_md5(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
    }
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,argc,&getp_md5::desc);
  if (iVar1 == 0) {
    md5_ez(hash,str + 2,(ulong)*(ushort *)str);
    vVar2 = create(0,hash,0x20);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar2;
  }
  return 1;
}

Assistant:

int CVmObjString::getp_md5(VMG_ vm_val_t *retval,
                           const vm_val_t *self_val,
                           const char *str, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the length and buffer pointer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* calculate the hash */
    char hash[33];
    md5_ez(hash, str, len);

    /* allocate the return string */
    retval->set_obj(create(vmg_ FALSE, hash, 32));

    /* done */
    return TRUE;
}